

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_msb_sdctr(uchar *blk,int len,BlowfishContext *ctx)

{
  uint32_t uVar1;
  uint32_t local_30;
  uint32_t tmp;
  uint32_t iv1;
  uint32_t iv0;
  uint32_t b [2];
  BlowfishContext *ctx_local;
  uchar *puStack_10;
  int len_local;
  uchar *blk_local;
  
  b = (uint32_t  [2])ctx;
  if ((len & 7U) == 0) {
    tmp = ctx->iv0;
    local_30 = ctx->iv1;
    puStack_10 = blk;
    for (ctx_local._4_4_ = len; 0 < ctx_local._4_4_; ctx_local._4_4_ = ctx_local._4_4_ + -8) {
      blowfish_encrypt(tmp,local_30,&iv1,(BlowfishContext *)b);
      uVar1 = GET_32BIT_MSB_FIRST(puStack_10);
      PUT_32BIT_MSB_FIRST(puStack_10,uVar1 ^ iv1);
      uVar1 = GET_32BIT_MSB_FIRST(puStack_10 + 4);
      PUT_32BIT_MSB_FIRST(puStack_10 + 4,uVar1 ^ iv0);
      local_30 = local_30 + 1;
      if (local_30 == 0) {
        tmp = tmp + 1;
      }
      puStack_10 = puStack_10 + 8;
    }
    *(uint32_t *)((long)b + 0x1048) = tmp;
    *(uint32_t *)((long)b + 0x104c) = local_30;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x1b5,"void blowfish_msb_sdctr(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_msb_sdctr(unsigned char *blk, int len,
                                     BlowfishContext * ctx)
{
    uint32_t b[2], iv0, iv1, tmp;

    assert((len & 7) == 0);

    iv0 = ctx->iv0;
    iv1 = ctx->iv1;

    while (len > 0) {
        blowfish_encrypt(iv0, iv1, b, ctx);
        tmp = GET_32BIT_MSB_FIRST(blk);
        PUT_32BIT_MSB_FIRST(blk, tmp ^ b[0]);
        tmp = GET_32BIT_MSB_FIRST(blk + 4);
        PUT_32BIT_MSB_FIRST(blk + 4, tmp ^ b[1]);
        if ((iv1 = (iv1 + 1) & 0xffffffff) == 0)
            iv0 = (iv0 + 1) & 0xffffffff;
        blk += 8;
        len -= 8;
    }

    ctx->iv0 = iv0;
    ctx->iv1 = iv1;
}